

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::iterate(AtomicCompSwapCase *this)

{
  TextureType TVar1;
  int z_00;
  Vector<int,_3> *pVVar2;
  GLenum GVar3;
  undefined8 log_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  deUint32 textureBufGL;
  GLSLVersion version;
  GLuint num_groups_y;
  Functional *this_00;
  Functions *pFVar11;
  MessageBuilder *pMVar12;
  long lVar13;
  char *__s;
  ProgramSources *sources;
  ImageLayerVerifier *verifyLayer;
  char *renderContext;
  TextureFormat *format;
  RenderContext *renderContext_00;
  ReturnValueVerifier *local_1778;
  ReturnValueVerifier *local_1760;
  deUint32 local_173c;
  deUint32 local_1738;
  deUint32 local_1734;
  deUint32 local_1730;
  char *local_1668;
  char *local_1640;
  char *local_1628;
  GLuint local_1534;
  DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>
  local_1522;
  undefined1 local_1521;
  ReturnValueVerifier *local_1520;
  undefined1 local_1511;
  ReturnValueVerifier *local_1510;
  undefined1 local_1508 [8];
  UniquePtr<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
  verifier;
  undefined1 local_14e8 [8];
  IVec3 relevantRegion;
  deUint32 textureToCheckBufGL;
  deUint32 textureToCheckGL;
  UniformAccessLogger uniforms;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1420;
  allocator<char> local_13f9;
  string local_13f8;
  allocator<char> local_13d1;
  string local_13d0;
  allocator<char> local_13a9;
  string local_13a8;
  string local_1388;
  allocator<char> local_1361;
  string local_1360;
  allocator<char> local_1339;
  string local_1338;
  allocator<char> local_1311;
  string local_1310;
  string local_12f0;
  byte local_12cd;
  allocator<char> local_12cc;
  byte local_12cb;
  byte local_12ca;
  byte local_12c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  string local_1248;
  string local_1228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e68;
  ShaderSource local_e48;
  ProgramSources local_e20;
  undefined1 local_d50 [8];
  ShaderProgram program;
  undefined1 local_c78 [8];
  string glslVersionDeclaration;
  string shaderImageTypeStr;
  string shaderImageFormatStr;
  undefined1 local_c10 [8];
  string invocationCoord;
  string local_be8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc8;
  byte local_ba6;
  byte local_ba5;
  int local_ba4;
  string local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  byte local_b5d;
  int local_b5c;
  string local_b58;
  undefined1 local_b38 [8];
  string atomicCoord;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  undefined1 local_af0 [8];
  string colorVecTypeName;
  undefined1 local_ac8 [8];
  string colorScalarTypeName;
  IVec3 local_a9c;
  MessageBuilder local_a90;
  MessageBuilder local_910;
  Vector<int,_3> local_790;
  Vector<int,_4> local_784;
  int local_774;
  int local_770;
  int x;
  int y;
  int z;
  LayeredImage imageData;
  MessageBuilder local_6f8;
  deUint32 local_574;
  MessageBuilder local_570;
  deUint32 local_3ec;
  MessageBuilder local_3e8;
  deUint32 local_264;
  MessageBuilder local_260;
  undefined1 local_e0 [8];
  Texture returnValueTexture;
  Texture endResultTexture;
  Buffer returnValueTextureBuf;
  Buffer endResultTextureBuf;
  undefined1 local_74 [2];
  bool isIntFormat;
  bool isUintFormat;
  int numSlicesOrFaces;
  Vector<int,_3> *local_68;
  IVec3 *imageSize;
  deUint32 textureTargetGL;
  TextureFormat local_50;
  deUint32 local_44;
  undefined1 local_40 [4];
  deUint32 internalFormatGL;
  CallLogWrapper glLog;
  TestLog *log;
  RenderContext *renderCtx;
  AtomicCompSwapCase *this_local;
  
  this_00 = (Functional *)gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glLog._16_8_ = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pFVar11 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))();
  glu::CallLogWrapper::CallLogWrapper((CallLogWrapper *)local_40,pFVar11,(TestLog *)glLog._16_8_);
  local_50 = this->m_format;
  local_44 = glu::getInternalFormat(local_50);
  imageSize._0_4_ = Functional::getGLTextureTarget(this->m_imageType);
  defaultImageSize((Functional *)local_74,this->m_imageType);
  local_68 = (Vector<int,_3> *)local_74;
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    local_1534 = 6;
  }
  else {
    local_1534 = tcu::Vector<int,_3>::z(local_68);
  }
  bVar4 = isFormatTypeUnsignedInteger((this->m_format).type);
  bVar5 = isFormatTypeSignedInteger((this->m_format).type);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &returnValueTextureBuf.super_ObjectWrapper.m_object,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &endResultTexture.super_ObjectWrapper.m_object,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)
             &returnValueTexture.super_ObjectWrapper.m_object,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_e0,(RenderContext *)this_00);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_40,true);
  tcu::TestLog::operator<<
            (&local_260,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar12 = tcu::MessageBuilder::operator<<(&local_260,(char (*) [28])"// Created a texture (name ")
  ;
  local_264 = glu::ObjectWrapper::operator*
                        ((ObjectWrapper *)&returnValueTexture.super_ObjectWrapper.m_object);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_264);
  pMVar12 = tcu::MessageBuilder::operator<<
                      (pMVar12,(char (*) [44])") to act as the target of atomic operations");
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_260);
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    tcu::TestLog::operator<<
              (&local_3e8,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_3e8,(char (*) [43])"// Created a buffer for the texture (name ");
    local_3ec = glu::ObjectWrapper::operator*
                          ((ObjectWrapper *)&returnValueTextureBuf.super_ObjectWrapper.m_object);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_3ec);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a94734);
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3e8);
  }
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    tcu::TestLog::operator<<
              (&local_570,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_570,(char (*) [28])"// Created a texture (name ");
    local_574 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_e0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_574);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (pMVar12,(char (*) [77])
                                 ") to which the intermediate return values of the atomic operation are stored"
                        );
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_570);
    if (this->m_imageType == TEXTURETYPE_BUFFER) {
      tcu::TestLog::operator<<
                (&local_6f8,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_6f8,(char (*) [43])"// Created a buffer for the texture (name ");
      imageData.m_tex2DArray.m_state._4_4_ =
           glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&endResultTexture.super_ObjectWrapper.m_object);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (pMVar12,(uint *)((long)&imageData.m_tex2DArray.m_state + 4));
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a94734);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6f8);
    }
  }
  TVar1 = this->m_imageType;
  iVar6 = tcu::Vector<int,_3>::x(local_68);
  iVar7 = tcu::Vector<int,_3>::y(local_68);
  iVar8 = tcu::Vector<int,_3>::z(local_68);
  LayeredImage::LayeredImage((LayeredImage *)&y,TVar1,&this->m_format,iVar6,iVar7,iVar8);
  for (x = 0; x < (int)local_1534; x = x + 1) {
    for (local_770 = 0; iVar6 = local_770, iVar7 = tcu::Vector<int,_3>::y(local_68), iVar6 < iVar7;
        local_770 = local_770 + 1) {
      for (local_774 = 0; iVar6 = local_774, iVar9 = tcu::Vector<int,_3>::x(local_68), z_00 = x,
          iVar8 = local_770, iVar7 = local_774, iVar6 < iVar9; local_774 = local_774 + 1) {
        tcu::Vector<int,_3>::Vector(&local_790,local_774,local_770,x);
        iVar6 = tcu::Vector<int,_3>::x(local_68);
        iVar6 = getCompareArg(&local_790,iVar6);
        tcu::Vector<int,_4>::Vector(&local_784,iVar6);
        Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                  ((LayeredImage *)&y,iVar7,iVar8,z_00,&local_784);
      }
    }
  }
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)local_40,0x84c0);
  GVar3 = (deUint32)imageSize;
  dVar10 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&returnValueTexture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_40,GVar3,dVar10);
  setTexParameteri((CallLogWrapper *)local_40,(deUint32)imageSize);
  tcu::TestLog::operator<<
            (&local_910,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar12 = tcu::MessageBuilder::operator<<
                      (&local_910,
                       (char (*) [51])"// Filling end-result texture with initial pattern");
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_910);
  dVar10 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&returnValueTextureBuf.super_ObjectWrapper.m_object);
  uploadTexture((CallLogWrapper *)local_40,(LayeredImage *)&y,dVar10);
  LayeredImage::~LayeredImage((LayeredImage *)&y);
  dVar10 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&returnValueTexture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)local_40,0,dVar10,0,'\x01',0,0x88ba,local_44);
  lVar13 = (**(code **)(*(long *)this_00 + 0x18))();
  dVar10 = (**(code **)(lVar13 + 0x800))();
  renderContext = (char *)0x951;
  glu::checkError(dVar10,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x951);
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)local_40,0x84c1);
    GVar3 = (deUint32)imageSize;
    dVar10 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_e0);
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_40,GVar3,dVar10);
    setTexParameteri((CallLogWrapper *)local_40,(deUint32)imageSize);
    tcu::TestLog::operator<<
              (&local_a90,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_a90,(char (*) [43])"// Setting storage of return-value texture");
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a90);
    dVar10 = local_44;
    pVVar2 = local_68;
    TVar1 = this->m_imageType;
    if (this->m_imageType == TEXTURETYPE_CUBE) {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)&colorScalarTypeName.field_2 + 8),5,5,1);
    }
    else {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)&colorScalarTypeName.field_2 + 8),5,1,1);
    }
    tcu::operator*((tcu *)&local_a9c,pVVar2,
                   (Vector<int,_3> *)((long)&colorScalarTypeName.field_2 + 8));
    textureBufGL = glu::ObjectWrapper::operator*
                             ((ObjectWrapper *)&endResultTexture.super_ObjectWrapper.m_object);
    setTextureStorage((CallLogWrapper *)local_40,TVar1,dVar10,&local_a9c,textureBufGL);
    dVar10 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_e0);
    glu::CallLogWrapper::glBindImageTexture
              ((CallLogWrapper *)local_40,1,dVar10,0,'\x01',0,0x88b9,local_44);
    lVar13 = (**(code **)(*(long *)this_00 + 0x18))();
    dVar10 = (**(code **)(lVar13 + 0x800))();
    renderContext = (char *)0x961;
    glu::checkError(dVar10,"glBindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x961);
  }
  if (bVar4) {
    local_1628 = "uint";
  }
  else {
    local_1628 = (char *)0x0;
    renderContext = "int";
    if (bVar5) {
      local_1628 = "int";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_ac8,local_1628,
             (allocator<char> *)(colorVecTypeName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(colorVecTypeName.field_2._M_local_buf + 0xf))
  ;
  if (bVar4) {
    local_1640 = "u";
  }
  else {
    local_1640 = (char *)0x0;
    renderContext = "i";
    if (bVar5) {
      local_1640 = "i";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b10,local_1640,
             (allocator<char> *)(atomicCoord.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_af0,
                 &local_b10,"vec4");
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator((allocator<char> *)(atomicCoord.field_2._M_local_buf + 0xf));
  local_b5d = 0;
  local_ba5 = 0;
  local_ba6 = 0;
  invocationCoord.field_2._M_local_buf[0xb] = '\0';
  invocationCoord.field_2._M_local_buf[10] = '\0';
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    local_b5c = tcu::Vector<int,_3>::x(local_68);
    de::toString<int>(&local_b58,&local_b5c);
    local_b5d = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b38,
                   "gx % ",&local_b58);
  }
  else if (this->m_imageType == TEXTURETYPE_2D) {
    local_ba4 = tcu::Vector<int,_3>::x(local_68);
    de::toString<int>(&local_ba0,&local_ba4);
    local_ba5 = 1;
    std::operator+(&local_b80,"ivec2(gx % ",&local_ba0);
    local_ba6 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b38,
                   &local_b80,", gy)");
  }
  else {
    invocationCoord.field_2._12_4_ = tcu::Vector<int,_3>::x(local_68);
    de::toString<int>(&local_be8,(int *)(invocationCoord.field_2._M_local_buf + 0xc));
    invocationCoord.field_2._M_local_buf[0xb] = '\x01';
    std::operator+(&local_bc8,"ivec3(gx % ",&local_be8);
    invocationCoord.field_2._M_local_buf[10] = '\x01';
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b38,
                   &local_bc8,", gy, gz)");
  }
  if ((invocationCoord.field_2._M_local_buf[10] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_bc8);
  }
  if ((invocationCoord.field_2._M_local_buf[0xb] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_be8);
  }
  if ((local_ba6 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b80);
  }
  if ((local_ba5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_ba0);
  }
  if ((local_b5d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b58);
  }
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    local_1668 = "gx";
  }
  else {
    local_1668 = "ivec3(gx, gy, gz)";
    renderContext = "ivec2(gx, gy)";
    if (this->m_imageType == TEXTURETYPE_2D) {
      local_1668 = "ivec2(gx, gy)";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c10,local_1668,
             (allocator<char> *)(shaderImageFormatStr.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(shaderImageFormatStr.field_2._M_local_buf + 0xf));
  getShaderImageFormatQualifier_abi_cxx11_
            ((string *)((long)&shaderImageTypeStr.field_2 + 8),(Functional *)&this->m_format,format)
  ;
  getShaderImageType_abi_cxx11_
            ((string *)((long)&glslVersionDeclaration.field_2 + 8),
             (Functional *)(ulong)(this->m_format).type,this->m_imageType,(TextureType)renderContext
            );
  program.m_program.m_info.linkTimeUs._4_4_ = (**(code **)(*(long *)this_00 + 0x10))();
  version = glu::getContextTypeGLSLVersion((ContextType)program.m_program.m_info.linkTimeUs._4_4_);
  __s = glu::getGLSLVersionDeclaration(version);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c78,__s,
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  glu::ProgramSources::ProgramSources(&local_e20);
  std::operator+(&local_1208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c78,"\n"
                );
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_1228,this_00,renderContext_00);
  std::operator+(&local_11e8,&local_1208,&local_1228);
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_1248,(Functional *)(ulong)this->m_imageType,(TextureType)this_00,
             (RenderContext *)renderContext);
  std::operator+(&local_11c8,&local_11e8,&local_1248);
  std::operator+(&local_11a8,&local_11c8,"\nprecision highp ");
  std::operator+(&local_1188,&local_11a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&glslVersionDeclaration.field_2 + 8));
  std::operator+(&local_1168,&local_1188,
                 ";\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout (")
  ;
  std::operator+(&local_1148,&local_1168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&shaderImageTypeStr.field_2 + 8));
  std::operator+(&local_1128,&local_1148,", binding=0) coherent uniform ");
  std::operator+(&local_1108,&local_1128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&glslVersionDeclaration.field_2 + 8));
  std::operator+(&local_10e8,&local_1108," u_results;\n");
  local_12c9 = 0;
  local_12ca = 0;
  local_12cb = 0;
  local_12cd = 0;
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_12c8,"layout (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&shaderImageTypeStr.field_2 + 8));
    local_12c9 = 1;
    std::operator+(&local_12a8,&local_12c8,", binding=1) writeonly uniform ");
    local_12ca = 1;
    std::operator+(&local_1288,&local_12a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&glslVersionDeclaration.field_2 + 8));
    local_12cb = 1;
    std::operator+(&local_1268,&local_1288," u_returnValues;\n");
  }
  else {
    std::allocator<char>::allocator();
    local_12cd = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1268,"",&local_12cc);
  }
  std::operator+(&local_10c8,&local_10e8,&local_1268);
  std::operator+(&local_10a8,&local_10c8,
                 "\nvoid main (void)\n{\n\tint gx = int(gl_GlobalInvocationID.x);\n\tint gy = int(gl_GlobalInvocationID.y);\n\tint gz = int(gl_GlobalInvocationID.z);\n\t"
                );
  std::operator+(&local_1088,&local_10a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac8);
  std::operator+(&local_1068,&local_1088," compare = ");
  std::operator+(&local_1048,&local_1068,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1310,"gx",&local_1311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1338,"gy",&local_1339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1360,"gz",&local_1361);
  iVar6 = tcu::Vector<int,_3>::x(local_68);
  getCompareArgShaderStr(&local_12f0,&local_1310,&local_1338,&local_1360,iVar6);
  std::operator+(&local_1028,&local_1048,&local_12f0);
  std::operator+(&local_1008,&local_1028,";\n\t");
  std::operator+(&local_fe8,&local_1008,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac8);
  std::operator+(&local_fc8,&local_fe8," data    = ");
  std::operator+(&local_fa8,&local_fc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13a8,"gx",&local_13a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13d0,"gy",&local_13d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13f8,"gz",&local_13f9);
  iVar6 = tcu::Vector<int,_3>::x(local_68);
  getAssignArgShaderStr(&local_1388,&local_13a8,&local_13d0,&local_13f8,iVar6);
  std::operator+(&local_f88,&local_fa8,&local_1388);
  std::operator+(&local_f68,&local_f88,";\n\t");
  std::operator+(&local_f48,&local_f68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac8);
  std::operator+(&local_f28,&local_f48," status  = ");
  std::operator+(&local_f08,&local_f28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac8);
  std::operator+(&local_ee8,&local_f08,"(-1);\n\tstatus = imageAtomicCompSwap(u_results, ");
  std::operator+(&local_ec8,&local_ee8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b38);
  std::operator+(&local_ea8,&local_ec8,", compare, data);\n");
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_1480,"\timageStore(u_returnValues, ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c10);
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
    std::operator+(&local_1460,&local_1480,", ");
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
    std::operator+(&local_1440,&local_1460,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_af0);
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 1;
    std::operator+(&local_1420,&local_1440,"(status));\n");
  }
  else {
    std::allocator<char>::allocator();
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1420,"",
               (allocator<char> *)
               ((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count
               + 4));
  }
  std::operator+(&local_e88,&local_ea8,&local_1420);
  std::operator+(&local_e68,&local_e88,"}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_e48,&local_e68);
  sources = glu::ProgramSources::operator<<(&local_e20,&local_e48);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_d50,(RenderContext *)this_00,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_e48);
  std::__cxx11::string::~string((string *)&local_e68);
  std::__cxx11::string::~string((string *)&local_e88);
  std::__cxx11::string::~string((string *)&local_1420);
  if ((uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) != 0)
  {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count
               + 4));
  }
  if ((uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1) != 0)
  {
    std::__cxx11::string::~string((string *)&local_1440);
  }
  if ((uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0)
  {
    std::__cxx11::string::~string((string *)&local_1460);
  }
  if ((uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0)
  {
    std::__cxx11::string::~string((string *)&local_1480);
  }
  std::__cxx11::string::~string((string *)&local_ea8);
  std::__cxx11::string::~string((string *)&local_ec8);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::__cxx11::string::~string((string *)&local_f08);
  std::__cxx11::string::~string((string *)&local_f28);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)&local_f68);
  std::__cxx11::string::~string((string *)&local_f88);
  std::__cxx11::string::~string((string *)&local_1388);
  std::__cxx11::string::~string((string *)&local_13f8);
  std::allocator<char>::~allocator(&local_13f9);
  std::__cxx11::string::~string((string *)&local_13d0);
  std::allocator<char>::~allocator(&local_13d1);
  std::__cxx11::string::~string((string *)&local_13a8);
  std::allocator<char>::~allocator(&local_13a9);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::__cxx11::string::~string((string *)&local_fe8);
  std::__cxx11::string::~string((string *)&local_1008);
  std::__cxx11::string::~string((string *)&local_1028);
  std::__cxx11::string::~string((string *)&local_12f0);
  std::__cxx11::string::~string((string *)&local_1360);
  std::allocator<char>::~allocator(&local_1361);
  std::__cxx11::string::~string((string *)&local_1338);
  std::allocator<char>::~allocator(&local_1339);
  std::__cxx11::string::~string((string *)&local_1310);
  std::allocator<char>::~allocator(&local_1311);
  std::__cxx11::string::~string((string *)&local_1048);
  std::__cxx11::string::~string((string *)&local_1068);
  std::__cxx11::string::~string((string *)&local_1088);
  std::__cxx11::string::~string((string *)&local_10a8);
  std::__cxx11::string::~string((string *)&local_10c8);
  std::__cxx11::string::~string((string *)&local_1268);
  if ((local_12cd & 1) != 0) {
    std::allocator<char>::~allocator(&local_12cc);
  }
  if ((local_12cb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1288);
  }
  if ((local_12ca & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_12a8);
  }
  if ((local_12c9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_12c8);
  }
  std::__cxx11::string::~string((string *)&local_10e8);
  std::__cxx11::string::~string((string *)&local_1108);
  std::__cxx11::string::~string((string *)&local_1128);
  std::__cxx11::string::~string((string *)&local_1148);
  std::__cxx11::string::~string((string *)&local_1168);
  std::__cxx11::string::~string((string *)&local_1188);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::__cxx11::string::~string((string *)&local_11c8);
  std::__cxx11::string::~string((string *)&local_1248);
  std::__cxx11::string::~string((string *)&local_11e8);
  std::__cxx11::string::~string((string *)&local_1228);
  std::__cxx11::string::~string((string *)&local_1208);
  glu::ProgramSources::~ProgramSources(&local_e20);
  pFVar11 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))();
  log_00 = glLog._16_8_;
  dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_d50);
  UniformAccessLogger::UniformAccessLogger
            ((UniformAccessLogger *)&textureToCheckGL,pFVar11,(TestLog *)log_00,dVar10);
  glu::operator<<((TestLog *)glLog._16_8_,(ShaderProgram *)local_d50);
  bVar4 = glu::ShaderProgram::isOk((ShaderProgram *)local_d50);
  if (bVar4) {
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_d50);
    glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_40,dVar10);
    iVar6 = tcu::Vector<int,_3>::x(local_68);
    num_groups_y = tcu::Vector<int,_3>::y(local_68);
    glu::CallLogWrapper::glDispatchCompute
              ((CallLogWrapper *)local_40,iVar6 * 5,num_groups_y,local_1534);
    lVar13 = (**(code **)(*(long *)this_00 + 0x18))();
    dVar10 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar10,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x99f);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
    this_local._4_4_ = STOP;
  }
  UniformAccessLogger::~UniformAccessLogger((UniformAccessLogger *)&textureToCheckGL);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_d50);
  std::__cxx11::string::~string((string *)local_c78);
  std::__cxx11::string::~string((string *)(glslVersionDeclaration.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(shaderImageTypeStr.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_c10);
  std::__cxx11::string::~string((string *)local_b38);
  std::__cxx11::string::~string((string *)local_af0);
  std::__cxx11::string::~string((string *)local_ac8);
  if (bVar4) {
    if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      local_1730 = glu::ObjectWrapper::operator*
                             ((ObjectWrapper *)&returnValueTexture.super_ObjectWrapper.m_object);
    }
    else {
      if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
        local_1734 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_e0);
      }
      else {
        local_1734 = 0xffffffff;
      }
      local_1730 = local_1734;
    }
    relevantRegion.m_data[2] = local_1730;
    if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      local_1738 = glu::ObjectWrapper::operator*
                             ((ObjectWrapper *)&returnValueTextureBuf.super_ObjectWrapper.m_object);
    }
    else {
      if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
        local_173c = glu::ObjectWrapper::operator*
                               ((ObjectWrapper *)&endResultTexture.super_ObjectWrapper.m_object);
      }
      else {
        local_173c = 0xffffffff;
      }
      local_1738 = local_173c;
    }
    pVVar2 = local_68;
    relevantRegion.m_data[1] = local_1738;
    if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      tcu::Vector<int,_3>::Vector
                ((Vector<int,_3> *)
                 &verifier.
                  super_UniqueBase<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                  .m_data.field_0xc,1,1,1);
    }
    else {
      tcu::Vector<int,_3>::Vector
                ((Vector<int,_3> *)
                 &verifier.
                  super_UniqueBase<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                  .m_data.field_0xc,5,1,1);
    }
    tcu::operator*((tcu *)local_14e8,pVVar2,
                   (Vector<int,_3> *)
                   &verifier.
                    super_UniqueBase<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                    .m_data.field_0xc);
    local_1511 = 0;
    local_1521 = 0;
    if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      local_1760 = (ReturnValueVerifier *)operator_new(0x10);
      local_1511 = 1;
      TVar1 = this->m_imageType;
      local_1510 = local_1760;
      iVar6 = tcu::Vector<int,_3>::x(local_68);
      EndResultVerifier::EndResultVerifier((EndResultVerifier *)local_1760,TVar1,iVar6);
    }
    else {
      if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
        local_1778 = (ReturnValueVerifier *)operator_new(0x10);
        local_1521 = 1;
        TVar1 = this->m_imageType;
        local_1520 = local_1778;
        iVar6 = tcu::Vector<int,_3>::x(local_68);
        ReturnValueVerifier::ReturnValueVerifier(local_1778,TVar1,iVar6);
      }
      else {
        local_1778 = (ReturnValueVerifier *)0x0;
      }
      local_1760 = local_1778;
    }
    de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>::
    DefaultDeleter(&local_1522);
    de::details::
    UniquePtr<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
    ::UniquePtr((UniquePtr<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                 *)local_1508,local_1760);
    iVar7 = relevantRegion.m_data[2];
    iVar6 = relevantRegion.m_data[1];
    TVar1 = this->m_imageType;
    verifyLayer = de::details::
                  UniqueBase<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                  ::operator*((UniqueBase<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                               *)local_1508);
    bVar4 = readTextureAndVerify
                      ((RenderContext *)this_00,(CallLogWrapper *)local_40,iVar7,iVar6,TVar1,
                       &this->m_format,(IVec3 *)local_14e8,verifyLayer);
    if (bVar4) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image verification failed");
    }
    this_local._4_4_ = STOP;
    de::details::
    UniquePtr<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
    ::~UniquePtr((UniquePtr<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                  *)local_1508);
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_e0);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)
             &returnValueTexture.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &endResultTexture.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &returnValueTextureBuf.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_40);
  return this_local._4_4_;
}

Assistant:

AtomicCompSwapCase::IterateResult AtomicCompSwapCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const IVec3&				imageSize				= defaultImageSize(m_imageType);
	const int					numSlicesOrFaces		= m_imageType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
	const bool					isIntFormat				= isFormatTypeSignedInteger(m_format.type);
	const glu::Buffer			endResultTextureBuf		(renderCtx);
	const glu::Buffer			returnValueTextureBuf	(renderCtx);
	const glu::Texture			endResultTexture		(renderCtx); //!< Texture for the final result; i.e. the texture on which the atomic operations are done. Size imageSize.
	const glu::Texture			returnValueTexture		(renderCtx); //!< Texture into which the return values are stored if m_caseType == CASETYPE_RETURN_VALUES.
																	 //	  Size imageSize*IVec3(N, 1, 1) or, for cube maps, imageSize*IVec3(N, N, 1) where N is NUM_INVOCATIONS_PER_PIXEL.

	DE_ASSERT(isUintFormat || isIntFormat);

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *endResultTexture << ") to act as the target of atomic operations" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *endResultTextureBuf << ")" << TestLog::EndMessage;

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		log << TestLog::Message << "// Created a texture (name " << *returnValueTexture << ") to which the intermediate return values of the atomic operation are stored" << TestLog::EndMessage;
		if (m_imageType == TEXTURETYPE_BUFFER)
			log << TestLog::Message << "// Created a buffer for the texture (name " << *returnValueTextureBuf << ")" << TestLog::EndMessage;
	}

	// Fill endResultTexture with initial pattern.

	{
		const LayeredImage imageData(m_imageType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		{
			for (int z = 0; z < numSlicesOrFaces; z++)
			for (int y = 0; y < imageSize.y(); y++)
			for (int x = 0; x < imageSize.x(); x++)
				imageData.setPixel(x, y, z, IVec4(getCompareArg(IVec3(x, y, z), imageSize.x())));
		}

		// Upload initial pattern to endResultTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE0);
		glLog.glBindTexture(textureTargetGL, *endResultTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Filling end-result texture with initial pattern" << TestLog::EndMessage;

		uploadTexture(glLog, imageData, *endResultTextureBuf);
	}

	glLog.glBindImageTexture(0, *endResultTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		// Set storage for returnValueTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE1);
		glLog.glBindTexture(textureTargetGL, *returnValueTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Setting storage of return-value texture" << TestLog::EndMessage;
		setTextureStorage(glLog, m_imageType, internalFormatGL, imageSize * (m_imageType == TEXTURETYPE_CUBE ? IVec3(NUM_INVOCATIONS_PER_PIXEL, NUM_INVOCATIONS_PER_PIXEL,	1)
																											 : IVec3(NUM_INVOCATIONS_PER_PIXEL, 1,							1)),
						  *returnValueTextureBuf);

		glLog.glBindImageTexture(1, *returnValueTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");
	}

	// Perform atomics in compute shader.

	{
		// Generate compute shader.

		const string colorScalarTypeName	= isUintFormat ? "uint" : isIntFormat ? "int" : DE_NULL;
		const string colorVecTypeName		= string(isUintFormat ? "u" : isIntFormat ? "i" : DE_NULL) + "vec4";
		const string atomicCoord			= m_imageType == TEXTURETYPE_BUFFER		? "gx % " + toString(imageSize.x())
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx % " + toString(imageSize.x()) + ", gy)"
											: "ivec3(gx % " + toString(imageSize.x()) + ", gy, gz)";
		const string invocationCoord		= m_imageType == TEXTURETYPE_BUFFER		? "gx"
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx, gy)"
											: "ivec3(gx, gy, gz)";
		const string shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const string glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ imageAtomicExtensionShaderRequires(renderCtx)
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) coherent uniform " + shaderImageTypeStr + " u_results;\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															  "layout (" + shaderImageFormatStr + ", binding=1) writeonly uniform " + shaderImageTypeStr + " u_returnValues;\n"
															: "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = int(gl_GlobalInvocationID.z);\n"
														"	" + colorScalarTypeName + " compare = " + colorScalarTypeName + getCompareArgShaderStr("gx", "gy", "gz", imageSize.x()) + ";\n"
														"	" + colorScalarTypeName + " data    = " + colorScalarTypeName + getAssignArgShaderStr("gx", "gy", "gz", imageSize.x()) + ";\n"
														"	" + colorScalarTypeName + " status  = " + colorScalarTypeName + "(-1);\n"
														"	status = imageAtomicCompSwap(u_results, " + atomicCoord + ", compare, data);\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															"	imageStore(u_returnValues, " + invocationCoord + ", " + colorVecTypeName + "(status));\n" :
															"") +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y(), numSlicesOrFaces);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Create reference, read texture and compare.

	{
		const deUint32								textureToCheckGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTexture
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTexture
																		: (deUint32)-1;

		const deUint32								textureToCheckBufGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTextureBuf
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTextureBuf
																		: (deUint32)-1;

		// The relevant region of the texture being checked (potentially
		// different from actual texture size for cube maps, because cube maps
		// may have unused pixels due to square size restriction).
		const IVec3									relevantRegion		= imageSize * (m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT	? IVec3(1,							1,							1)
																					 :														  IVec3(NUM_INVOCATIONS_PER_PIXEL,	1,							1));

		const UniquePtr<const ImageLayerVerifier>	verifier			(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? new EndResultVerifier(m_imageType, imageSize.x())
																	   : m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES		? new ReturnValueVerifier(m_imageType, imageSize.x())
																	   : (ImageLayerVerifier*)DE_NULL);

		if (readTextureAndVerify(renderCtx, glLog, textureToCheckGL, textureToCheckBufGL, m_imageType, m_format, relevantRegion, *verifier))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

		return STOP;
	}
}